

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

size_t __thiscall QPDF::tableSize(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  ulong i;
  long lVar2;
  type ii;
  int iVar3;
  int iVar4;
  int iVar5;
  string local_48;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  iVar5 = 0;
  iVar4 = 0;
  if (*(size_t *)((long)&(_Var1._M_head_impl)->xref_table + 0x28) != 0) {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->xref_table + 8));
    iVar4 = *(int *)(lVar2 + 0x20);
  }
  if (*(size_t *)((long)&(_Var1._M_head_impl)->obj_cache + 0x28) != 0) {
    lVar2 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->obj_cache + 8));
    iVar5 = *(int *)(lVar2 + 0x20);
  }
  if ((0x7ffffffd < iVar5) || (0x7ffffffd < iVar4)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Impossibly large object id encountered.","");
    stopOnError(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  i = *(size_t *)
       ((long)&((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache + 0x28);
  if ((i & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
  }
  iVar3 = (int)i;
  if ((int)i < iVar4) {
    iVar3 = iVar4;
  }
  if ((double)iVar5 < (double)iVar3 * 1.1) {
    iVar4 = iVar5;
  }
  if (iVar4 < -1) {
    QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar4 + 1);
  }
  return (long)(iVar4 + 1);
}

Assistant:

size_t
QPDF::tableSize()
{
    // If obj_cache is dense, accommodate all object in tables,else accommodate only original
    // objects.
    auto max_xref = m->xref_table.size() ? m->xref_table.crbegin()->first.getObj() : 0;
    auto max_obj = m->obj_cache.size() ? m->obj_cache.crbegin()->first.getObj() : 0;
    auto max_id = std::numeric_limits<int>::max() - 1;
    if (max_obj >= max_id || max_xref >= max_id) {
        // Temporary fix. Long-term solution is
        // - QPDFObjGen to enforce objgens are valid and sensible
        // - xref table and obj cache to protect against insertion of impossibly large obj ids
        stopOnError("Impossibly large object id encountered.");
    }
    if (max_obj < 1.1 * std::max(toI(m->obj_cache.size()), max_xref)) {
        return toS(++max_obj);
    }
    return toS(++max_xref);
}